

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> * __thiscall
pbrt::ParameterDictionary::GetRGBArray(ParameterDictionary *this,string *name)

{
  Float r;
  __type_conflict _Var1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  const_reference pvVar5;
  reference pvVar6;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *in_RDI;
  int i;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *rgb;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  value_type_conflict g;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  RGB local_5c;
  int local_50;
  undefined1 local_39;
  ParsedParameter *local_38;
  const_iterator local_30;
  const_iterator local_28;
  
  local_28 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RSI);
  local_30 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::end(in_stack_ffffffffffffff50);
  while( true ) {
    if (local_28 == local_30) {
      memset(in_RDI,0,0x18);
      std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::vector
                ((vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *)0x74339f);
      return in_RDI;
    }
    local_38 = *local_28;
    _Var1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if ((_Var1) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff50,
                                (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                )), bVar2)) break;
    local_28 = local_28 + 1;
  }
  sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(&local_38->floats);
  if (sVar3 % 3 == 0) {
    local_39 = 0;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(&local_38->floats);
    std::allocator<pbrt::RGB>::allocator((allocator<pbrt::RGB> *)0x7431c6);
    std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::vector
              ((vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::allocator<pbrt::RGB>::~allocator((allocator<pbrt::RGB> *)0x7431e6);
    local_50 = 0;
    while( true ) {
      uVar4 = (ulong)local_50;
      sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(&local_38->floats)
      ;
      if (sVar3 / 3 <= uVar4) break;
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&local_38->floats,(long)(local_50 * 3));
      r = *pvVar5;
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&local_38->floats,(long)(local_50 * 3 + 1));
      g = *pvVar5;
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (&local_38->floats,(long)(local_50 * 3 + 2));
      RGB::RGB(&local_5c,r,g,*pvVar5);
      pvVar6 = std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::operator[](in_RDI,(long)local_50)
      ;
      pvVar6->r = local_5c.r;
      pvVar6->g = local_5c.g;
      pvVar6->b = local_5c.b;
      local_50 = local_50 + 1;
    }
    local_38->lookedUp = true;
    return in_RDI;
  }
  ErrorExit((FileLoc *)in_stack_ffffffffffffff50,
            (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
}

Assistant:

std::vector<RGB> ParameterDictionary::GetRGBArray(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->floats.size() % 3)
                ErrorExit(&p->loc, "Number of values given for \"rgb\" parameter %d "
                                   "\"name\" isn't a multiple of 3.");

            std::vector<RGB> rgb(p->floats.size() / 3);
            for (int i = 0; i < p->floats.size() / 3; ++i)
                rgb[i] =
                    RGB(p->floats[3 * i], p->floats[3 * i + 1], p->floats[3 * i + 2]);

            p->lookedUp = true;
            return rgb;
        }
    }
    return {};
}